

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

MessageSizeCounts __thiscall capnp::_::ListReader::totalSize(ListReader *this)

{
  long lVar1;
  ElementSize EVar2;
  uint uVar3;
  Iterator __begin4;
  uint uVar4;
  WirePointer *ref;
  StructPointerCount SVar5;
  long lVar6;
  ulong uVar7;
  WordCount64 amount;
  bool bVar8;
  MessageSizeCounts MVar9;
  Iterator __end4;
  
  EVar2 = this->elementSize;
  uVar7 = 0;
  if (EVar2 - 1 < 5) {
    amount = (ulong)*(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)EVar2 * 4) * (ulong)this->elementCount
             + 0x3f >> 6;
  }
  else if (EVar2 == POINTER) {
    amount = (WordCount64)this->elementCount;
    lVar1 = amount * 8;
    uVar7 = 0;
    for (lVar6 = 0; lVar1 - lVar6 != 0; lVar6 = lVar6 + 8) {
      MVar9 = WireHelpers::totalSize
                        (this->segment,(WirePointer *)(this->ptr + lVar6),this->nestingLimit);
      amount = amount + MVar9.wordCount;
      uVar7 = (ulong)((int)uVar7 + MVar9.capCount);
    }
  }
  else if (EVar2 == INLINE_COMPOSITE) {
    uVar3 = this->elementCount;
    amount = ((ulong)this->step * (ulong)uVar3 >> 6) + 1;
    if (this->structPointerCount != 0) {
      ref = (WirePointer *)this->ptr;
      uVar7 = 0;
      for (uVar4 = 0; uVar4 != uVar3; uVar4 = uVar4 + 1) {
        ref = ref + (this->structDataSize >> 6);
        SVar5 = this->structPointerCount;
        while (bVar8 = SVar5 != 0, SVar5 = SVar5 - 1, bVar8) {
          MVar9 = WireHelpers::totalSize(this->segment,ref,this->nestingLimit);
          amount = amount + MVar9.wordCount;
          uVar7 = (ulong)((int)uVar7 + MVar9.capCount);
          ref = ref + 1;
        }
      }
    }
  }
  else {
    amount = 0;
  }
  if (this->segment != (SegmentReader *)0x0) {
    SegmentReader::unread(this->segment,amount);
  }
  MVar9._8_8_ = uVar7;
  MVar9.wordCount = amount;
  return MVar9;
}

Assistant:

MessageSizeCounts ListReader::totalSize() const {
  // TODO(cleanup): This is kind of a lot of logic duplicated from WireHelpers::totalSize(), but
  //   it's unclear how to share it effectively.

  MessageSizeCounts result = { ZERO * WORDS, 0 };

  switch (elementSize) {
    case ElementSize::VOID:
      // Nothing.
      break;
    case ElementSize::BIT:
    case ElementSize::BYTE:
    case ElementSize::TWO_BYTES:
    case ElementSize::FOUR_BYTES:
    case ElementSize::EIGHT_BYTES:
      result.addWords(WireHelpers::roundBitsUpToWords(
          upgradeBound<uint64_t>(elementCount) * dataBitsPerElement(elementSize)));
      break;
    case ElementSize::POINTER: {
      auto count = elementCount * (POINTERS / ELEMENTS);
      result.addWords(count * WORDS_PER_POINTER);

      for (auto i: kj::zeroTo(count)) {
        result += WireHelpers::totalSize(segment, reinterpret_cast<const WirePointer*>(ptr) + i,
                                         nestingLimit);
      }
      break;
    }
    case ElementSize::INLINE_COMPOSITE: {
      // Don't forget to count the tag word.
      auto wordSize = upgradeBound<uint64_t>(elementCount) * step / BITS_PER_WORD;
      result.addWords(wordSize + POINTER_SIZE_IN_WORDS);

      if (structPointerCount > ZERO * POINTERS) {
        const word* pos = reinterpret_cast<const word*>(ptr);
        for (auto i KJ_UNUSED: kj::zeroTo(elementCount)) {
          pos += structDataSize / BITS_PER_WORD;

          for (auto j KJ_UNUSED: kj::zeroTo(structPointerCount)) {
            result += WireHelpers::totalSize(segment, reinterpret_cast<const WirePointer*>(pos),
                                             nestingLimit);
            pos += POINTER_SIZE_IN_WORDS;
          }
        }
      }
      break;
    }
  }

  if (segment != nullptr) {
    // This traversal should not count against the read limit, because it's highly likely that
    // the caller is going to traverse the object again, e.g. to copy it.
    segment->unread(result.wordCount);
  }

  return result;
}